

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::DumpConstantTable(FunctionBody *dumpFunction)

{
  code *pcVar1;
  bool bVar2;
  OpCode op;
  RegSlot RVar3;
  int32 value;
  BOOL BVar4;
  int iVar5;
  ModuleID value_00;
  undefined8 *aValue;
  undefined4 *puVar6;
  char16 *pcVar7;
  RecyclableObject *this;
  JavascriptBoolean *this_00;
  JavascriptString *pJVar8;
  undefined4 extraout_var;
  ScriptContext *this_01;
  char16_t *pcVar9;
  Var varConst;
  RegSlot reg;
  uint count;
  FunctionBody *dumpFunction_local;
  TypeId local_18;
  TypeId typeId;
  
  Output::Print(L"    Constant Table:\n    ======== =====\n    ");
  RVar3 = FunctionBody::GetConstantCount(dumpFunction);
  varConst._0_4_ = 1;
  do {
    if (RVar3 <= (RegSlot)varConst) {
      Output::Print(L"\n");
      return;
    }
    DumpReg((RegSlot)varConst);
    aValue = (undefined8 *)FunctionBody::GetConstantVar(dumpFunction,(RegSlot)varConst);
    if (aValue == (undefined8 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                  ,0x8f,"(varConst != nullptr)","varConst != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar2 = TaggedInt::Is(aValue);
    if (bVar2) {
      pcVar7 = OpCodeUtil::GetOpCodeName(LdC_A_I4);
      Output::Print(L"%-10s",pcVar7);
      value = TaggedInt::ToInt32(aValue);
      DumpI4(value);
    }
    else if (aValue == &NullFrameDisplay) {
      pcVar7 = OpCodeUtil::GetOpCodeName(LdNullDisplay);
      Output::Print(L"%-10s",pcVar7);
    }
    else if (aValue == &StrictNullFrameDisplay) {
      pcVar7 = OpCodeUtil::GetOpCodeName(LdStrictNullDisplay);
      Output::Print(L"%-10s",pcVar7);
    }
    else {
      if (aValue == (undefined8 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar2 = TaggedInt::Is(aValue);
      if (bVar2) {
        local_18 = TypeIds_FirstNumberType;
      }
      else {
        bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aValue);
        if (bVar2) {
          local_18 = TypeIds_Number;
        }
        else {
          this = UnsafeVarTo<Js::RecyclableObject>(aValue);
          if (this == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          local_18 = RecyclableObject::GetTypeId(this);
          if ((0x57 < (int)local_18) && (BVar4 = RecyclableObject::IsExternal(this), BVar4 == 0)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
        }
      }
      switch(local_18) {
      case TypeIds_Undefined:
        pcVar7 = OpCodeUtil::GetOpCodeName(Ld_A);
        Output::Print(L"%-10s",pcVar7);
        Output::Print(L" (undefined)");
        break;
      case TypeIds_Null:
        pcVar7 = OpCodeUtil::GetOpCodeName(Ld_A);
        Output::Print(L"%-10s",pcVar7);
        Output::Print(L" (null)");
        break;
      case TypeIds_Boolean:
        this_00 = VarTo<Js::JavascriptBoolean>(aValue);
        BVar4 = JavascriptBoolean::GetValue(this_00);
        op = LdFalse;
        if (BVar4 != 0) {
          op = LdTrue;
        }
        pcVar7 = OpCodeUtil::GetOpCodeName(op);
        Output::Print(L"%-10s",pcVar7);
        break;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                    ,0xe9,"((0))","Unexpected object type in DumpConstantTable");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
        break;
      case TypeIds_Number:
        pcVar7 = OpCodeUtil::GetOpCodeName(LdC_A_R8);
        Output::Print(L"%-10s",pcVar7);
        JavascriptNumber::GetValue(aValue);
        Output::Print(L"%G");
        break;
      case TypeIds_String:
        pcVar7 = OpCodeUtil::GetOpCodeName(LdStr);
        Output::Print(L"%-10s",pcVar7);
        pJVar8 = VarTo<Js::JavascriptString>(aValue);
        iVar5 = (*(pJVar8->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
        bVar2 = VarIs<Js::PropertyString>(aValue);
        pcVar9 = L"";
        if (bVar2) {
          pcVar9 = L" [prop]";
        }
        Output::Print(L" (\"%s\")%s",CONCAT44(extraout_var,iVar5),pcVar9);
        break;
      case TypeIds_BigInt:
        pcVar7 = OpCodeUtil::GetOpCodeName(BigIntLiteral);
        Output::Print(L"%-10s",pcVar7);
        break;
      case TypeIds_ArrayLastWithES5:
        Output::Print(L"%-10s",L"LdStringTemplate");
        this_01 = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
        ScriptContext::GetLibrary(this_01);
        pcVar7 = JavascriptLibrary::GetStringTemplateCallsiteObjectKey(aValue);
        Output::Print(L" (\"%s\")",pcVar7);
        break;
      case TypeIds_GlobalObject:
        pcVar7 = OpCodeUtil::GetOpCodeName(LdRoot);
        Output::Print(L"%-10s",pcVar7);
        break;
      case TypeIds_LastTrueJavascriptObjectType:
        pcVar7 = OpCodeUtil::GetOpCodeName(LdModuleRoot);
        Output::Print(L"%-10s",pcVar7);
        value_00 = FunctionBody::GetModuleID(dumpFunction);
        DumpI4(value_00);
      }
    }
    Output::Print(L"\n    ");
    varConst._0_4_ = (RegSlot)varConst + 1;
  } while( true );
}

Assistant:

void ByteCodeDumper::DumpConstantTable(FunctionBody *dumpFunction)
    {
        Output::Print(_u("    Constant Table:\n    ======== =====\n    "));
        uint count = dumpFunction->GetConstantCount();
        for (RegSlot reg = FunctionBody::FirstRegSlot; reg < count; reg++)
        {
            DumpReg(reg);
            Var varConst = dumpFunction->GetConstantVar(reg);
            Assert(varConst != nullptr);
            if (TaggedInt::Is(varConst))
            {
#if ENABLE_NATIVE_CODEGEN
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdC_A_I4));
#else
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                DumpI4(TaggedInt::ToInt32(varConst));
            }
            else if (varConst == (Js::Var)&Js::NullFrameDisplay)
            {
#if ENABLE_NATIVE_CODEGEN
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdNullDisplay));
#else
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
                Output::Print(_u(" (NullDisplay)"));
#endif
            }
            else if (varConst == (Js::Var)&Js::StrictNullFrameDisplay)
            {
#if ENABLE_NATIVE_CODEGEN
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdStrictNullDisplay));
#else
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
                Output::Print(_u(" (StrictNullDisplay)"));
#endif
            }
            else
            {
                switch (JavascriptOperators::GetTypeId(varConst))
                {
                case Js::TypeIds_Undefined:
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
                    Output::Print(_u(" (undefined)"));
                    break;
                case Js::TypeIds_Null:
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
                    Output::Print(_u(" (null)"));
                    break;
                case Js::TypeIds_Boolean:
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(
                        VarTo<JavascriptBoolean>(varConst)->GetValue() ? OpCode::LdTrue : OpCode::LdFalse));
                    break;
                case Js::TypeIds_Number:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdC_A_R8));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    Output::Print(_u("%G"), JavascriptNumber::GetValue(varConst));
                    break;
                case Js::TypeIds_BigInt:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::BigIntLiteral));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    break;
                case Js::TypeIds_String:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdStr));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    Output::Print(_u(" (\"%s\")%s"), VarTo<JavascriptString>(varConst)->GetSz(), Js::VarIs<Js::PropertyString>(varConst) ? _u(" [prop]") : _u(""));
                    break;
                case Js::TypeIds_GlobalObject:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdRoot));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    break;
                case Js::TypeIds_ModuleRoot:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdModuleRoot));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    DumpI4(dumpFunction->GetModuleID());
                    break;
                case Js::TypeIds_ES5Array:
                    // ES5Array objects in the constant table are always string template callsite objects.
                    // If we later put other ES5Array objects in the constant table, we'll need another way
                    // to decide the constant type.
                    Output::Print(_u("%-10s"), _u("LdStringTemplate"));
                    Output::Print(_u(" (\"%s\")"), dumpFunction->GetScriptContext()->GetLibrary()->GetStringTemplateCallsiteObjectKey(varConst));
                    break;
                default:
                    AssertMsg(UNREACHED, "Unexpected object type in DumpConstantTable");
                    break;
                }
            }
            Output::Print(_u("\n    "));
        }
        Output::Print(_u("\n"));
    }